

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O2

bool __thiscall
jsoncons::cbor::
basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
::visit_typed_array(basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
                    *this,span<const_int,_18446744073709551615UL> *data,semantic_tag tag,
                   ser_context *context,error_code *ec)

{
  int *piVar1;
  byte_string_view local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  
  if ((this->options_).use_typed_arrays_ == true) {
    write_tag(this,0x4e);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&v,data->size_ << 2,(allocator_type *)&local_50);
    memcpy(v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,data->data_,data->size_ << 2);
    local_50.data_ =
         v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_50.size_ =
         (long)v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    write_byte_string(this,&local_50);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  else {
    (*(this->super_basic_json_visitor<char>)._vptr_basic_json_visitor[7])(this,data->size_,0);
    if (ec->_M_value == 0) {
      piVar1 = data->data_;
      do {
        if (piVar1 == data->data_ + data->size_) {
          (*(this->super_basic_json_visitor<char>)._vptr_basic_json_visitor[8])(this,context,ec);
          return true;
        }
        (*(this->super_basic_json_visitor<char>)._vptr_basic_json_visitor[0x10])
                  (this,(long)*piVar1,0,context,ec);
        piVar1 = piVar1 + 1;
      } while (ec->_M_value == 0);
    }
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_typed_array(const jsoncons::span<const int32_t>& data,  
        semantic_tag tag,
        const ser_context& context, 
        std::error_code& ec) override
    {
        if (options_.use_typed_arrays())
        {
            write_typed_array_tag(std::integral_constant<bool, jsoncons::endian::native == jsoncons::endian::big>(), 
                                  int32_t(), 
                                  tag);
            std::vector<uint8_t> v(data.size()*sizeof(int32_t));
            std::memcpy(v.data(), data.data(), data.size()*sizeof(int32_t));
            write_byte_string(byte_string_view(v));
            JSONCONS_VISITOR_RETURN;
        }
        else
        {
            this->begin_array(data.size(), semantic_tag::none,context, ec);
            if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
            for (auto p = data.begin(); p != data.end(); ++p)
            {
                this->int64_value(*p,semantic_tag::none,context, ec);
                if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
            }
            this->end_array(context, ec);
            JSONCONS_VISITOR_RETURN;
        }
    }